

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall NDevice::NDevice(NDevice *this)

{
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__NDevice_005d6228;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::vector
            ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)0x35135c);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"");
  *(undefined4 *)&in_RDI[5]._vptr_NetworkDataType = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[5]._vptr_NetworkDataType + 4) = 0xffffffff;
  return;
}

Assistant:

NDevice::NDevice() : NetworkDataType() {
    name = "";
    numBytes = -1;
    byteOffset = -1;

}